

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int query_pattr(attr_list list,atom_t attr_id,attr_value_type *val_type_p,attr_union *value_p)

{
  ulong uVar1;
  int_attr *piVar2;
  double *pdVar3;
  int_attr_struct *piVar4;
  attr_p paVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int i;
  long lVar10;
  
  if (list == (attr_list)0x0) {
    iVar7 = 0;
  }
  else if (list->list_of_lists == 0) {
    piVar4 = (list->l).list.iattrs;
    uVar9 = 0;
    do {
      if (piVar4->int_attr_count == uVar9) {
        lVar10 = 0;
        do {
          lVar8 = lVar10;
          if ((ulong)piVar4->other_attr_count * 0x18 + 0x18 == lVar8 + 0x18) {
            return 0;
          }
          paVar5 = (list->l).list.attributes;
          lVar10 = lVar8 + 0x18;
        } while (*(int *)((long)&paVar5->attr_id + lVar8) != attr_id);
        if (val_type_p != (attr_value_type *)0x0) {
          *val_type_p = *(attr_value_type *)((long)&paVar5->val_type + lVar8);
        }
        if (value_p == (attr_union *)0x0) {
          return 1;
        }
        pdVar3 = (double *)((long)&(((list->l).list.attributes)->value).u + lVar8);
        pvVar6 = (void *)pdVar3[1];
        (value_p->u).d = *pdVar3;
        (value_p->u).o.buffer = pvVar6;
        return 1;
      }
      uVar1 = uVar9 + 1;
      piVar2 = piVar4->iattr + uVar9;
      uVar9 = uVar1;
    } while (piVar2->attr_id != attr_id);
    if (val_type_p != (attr_value_type *)0x0) {
      *val_type_p = Attr_Int4;
    }
    iVar7 = 1;
    if (value_p != (attr_union *)0x0) {
      (value_p->u).f = *(float *)((list->l).lists.lists + uVar1);
    }
  }
  else {
    lVar10 = 0;
    do {
      if ((list->l).lists.sublist_count <= lVar10) {
        return 0;
      }
      iVar7 = query_pattr((list->l).lists.lists[lVar10],attr_id,val_type_p,value_p);
      lVar10 = lVar10 + 1;
    } while (iVar7 == 0);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

extern int
query_pattr(attr_list list, atom_t attr_id, attr_value_type *val_type_p, attr_union *value_p)
{
    if (list == NULL) return 0;
    if (list->list_of_lists) {
        int i;
        for (i=0; i< list->l.lists.sublist_count; i++) {
            if (query_pattr(list->l.lists.lists[i], attr_id, val_type_p,
                           value_p)) {
                return 1;
            }
        }
        return 0;
    } else {
	int index = 0;
	while(index < list->l.list.iattrs->int_attr_count) {
	    if (list->l.list.iattrs->iattr[index].attr_id == attr_id) {
		if (val_type_p != NULL) {
		    *val_type_p = Attr_Int4;
		}
		if (value_p != NULL) {
		    if (sizeof(long) != 4){
			value_p->u.i = (int)(long)list->l.list.iattrs->iattr[index].value;
		    } else {
			value_p->u.l = list->l.list.iattrs->iattr[index].value;
		    }
		}
		return 1;
	    }
	    index++;
        }
	index = 0;
	while(index < list->l.list.iattrs->other_attr_count) {
	    if (list->l.list.attributes[index].attr_id == attr_id) {
		if (val_type_p != NULL) {
		    *val_type_p = list->l.list.attributes[index].val_type;
		}
		if (value_p != NULL) {
		    *value_p = list->l.list.attributes[index].value;
		}
		return 1;
	    }
	    index++;
        }
        return 0;
    }
}